

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsscanf.c
# Opt level: O2

int vsscanf(char *__s,char *__format,__gnuc_va_list __arg)

{
  byte bVar1;
  int iVar2;
  unsigned_long uVar3;
  byte *pbVar4;
  _PDCLIB_status_t local_88;
  
  local_88.i = 0;
  local_88.current = 0;
  local_88.base = 0;
  local_88.flags = 0;
  local_88.n = 0;
  local_88.width = 0;
  local_88.prec = -1;
  local_88.stream = (_PDCLIB_file_t *)0x0;
  local_88.arg[0]._0_8_ = *__arg;
  local_88.arg[0].overflow_arg_area = *(void **)((long)__arg + 8);
  local_88.arg[0].reg_save_area = *(void **)((long)__arg + 0x10);
  local_88.s = __s;
  do {
    for (; bVar1 = *__format, bVar1 != 0x25; __format = (char *)((byte *)__format + 1)) {
      if (bVar1 == 0) goto LAB_001049f1;
LAB_00104988:
      iVar2 = isspace((uint)bVar1);
      uVar3 = local_88.i;
      pbVar4 = (byte *)local_88.s;
      if (iVar2 == 0) {
        if (*local_88.s != bVar1) {
          if (*local_88.s == 0) {
            return -(uint)(local_88.n == 0) | (uint)local_88.n;
          }
          return (uint)local_88.n;
        }
        local_88.s = local_88.s + 1;
        local_88.i = local_88.i + 1;
      }
      else {
        do {
          local_88.s = (char *)pbVar4;
          local_88.i = uVar3;
          uVar3 = local_88.i + 1;
          pbVar4 = (byte *)(local_88.s + 1);
          iVar2 = isspace((uint)(byte)*local_88.s);
        } while (iVar2 != 0);
      }
    }
    pbVar4 = (byte *)_PDCLIB_scan(__format,&local_88);
    if (pbVar4 == (byte *)__format) {
      bVar1 = *__format;
      goto LAB_00104988;
    }
    __format = (char *)pbVar4;
  } while (pbVar4 != (byte *)0x0);
  if ((*local_88.s == 10) && (local_88.n == 0)) {
    local_88.n = 0xffffffffffffffff;
  }
LAB_001049f1:
  return (int)local_88.n;
}

Assistant:

int vsscanf( const char * _PDCLIB_restrict s, const char * _PDCLIB_restrict format, va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = 0;
    status.i = 0;
    status.current = 0;
    status.s = ( char * ) s;
    status.width = 0;
    status.prec = EOF;
    status.stream = NULL;
    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_scan( format, &status ) ) == format ) )
        {
            /* No conversion specifier, match verbatim */
            if ( isspace( (unsigned char)*format ) )
            {
                /* Whitespace char in format string: Skip all whitespaces */
                /* No whitespaces in input do not result in matching error */
                while ( isspace( (unsigned char)*status.s ) )
                {
                    ++status.s;
                    ++status.i;
                }
            }
            else
            {
                /* Non-whitespace char in format string: Match verbatim */
                if ( *status.s != *format )
                {
                    if ( *status.s == '\0' && status.n == 0 )
                    {
                        /* Early input error */
                        return EOF;
                    }

                    /* Matching error */
                    return status.n;
                }
                else
                {
                    ++status.s;
                    ++status.i;
                }
            }

            ++format;
        }
        else
        {
            /* NULL return code indicates error */
            if ( rc == NULL )
            {
                if ( ( *status.s == '\n' ) && ( status.n == 0 ) )
                {
                    status.n = EOF;
                }

                break;
            }

            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    va_end( status.arg );
    return status.n;
}